

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

TEdge * ClipperLib::GetMaximaPairEx(TEdge *e)

{
  bool bVar1;
  TEdge *result;
  TEdge *e_local;
  
  e_local = GetMaximaPair(e);
  if ((e_local != (TEdge *)0x0) &&
     ((e_local->OutIdx == -2 ||
      ((e_local->NextInAEL == e_local->PrevInAEL && (bVar1 = IsHorizontal(e_local), !bVar1)))))) {
    e_local = (TEdge *)0x0;
  }
  return e_local;
}

Assistant:

TEdge *GetMaximaPairEx(TEdge *e)
{
  //as GetMaximaPair() but returns 0 if MaxPair isn't in AEL (unless it's horizontal)
  TEdge* result = GetMaximaPair(e);
  if (result && (result->OutIdx == Skip ||
    (result->NextInAEL == result->PrevInAEL && !IsHorizontal(*result)))) return 0;
  return result;
}